

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginTest.cpp
# Opt level: O3

void __thiscall
TEST_PluginTest_RemovePluginByName_Test::testBody(TEST_PluginTest_RemovePluginByName_Test *this)

{
  TestRegistry *pTVar1;
  int iVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  SimpleString local_28;
  
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry;
  (*pTVar1->_vptr_TestRegistry[0xd])
            (pTVar1,(this->super_TEST_GROUP_CppUTestGroupPluginTest).secondPlugin);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry;
  (*pTVar1->_vptr_TestRegistry[0xd])
            (pTVar1,(this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin);
  pUVar3 = UtestShell::getCurrent();
  iVar2 = (*((this->super_TEST_GROUP_CppUTestGroupPluginTest).registry)->_vptr_TestRegistry[0x12])()
  ;
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,3,(long)iVar2,"LONGS_EQUAL(3, registry->countPlugins()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
             ,0x9c,pTVar4);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry;
  SimpleString::SimpleString(&local_28,"GenericPlugin2");
  (*pTVar1->_vptr_TestRegistry[0x11])(pTVar1,&local_28);
  SimpleString::~SimpleString(&local_28);
  pUVar3 = UtestShell::getCurrent();
  iVar2 = (*((this->super_TEST_GROUP_CppUTestGroupPluginTest).registry)->_vptr_TestRegistry[0x12])()
  ;
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,2,(long)iVar2,"LONGS_EQUAL(2, registry->countPlugins()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
             ,0x9e,pTVar4);
  return;
}

Assistant:

TEST(PluginTest, RemovePluginByName)
{
    registry->installPlugin(secondPlugin);
    registry->installPlugin(thirdPlugin);
    LONGS_EQUAL(3, registry->countPlugins());
    registry->removePluginByName(GENERIC_PLUGIN2);
    LONGS_EQUAL(2, registry->countPlugins());
}